

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O2

bool __thiscall
bssl::Vector<NotDefaultConstructible>::Push
          (Vector<NotDefaultConstructible> *this,NotDefaultConstructible *elem)

{
  ulong uVar1;
  NotDefaultConstructible *pNVar2;
  NotDefaultConstructible *pNVar3;
  long lVar4;
  int line;
  size_t sVar5;
  ulong uVar6;
  
  uVar6 = this->size_;
  uVar1 = this->capacity_;
  if (uVar6 < uVar1) {
    pNVar3 = this->data_;
  }
  else {
    if (uVar1 == 0) {
      sVar5 = 0x10;
    }
    else {
      if ((long)uVar1 < 0) {
        line = 0x14d;
LAB_002d4659:
        ERR_put_error(0xe,0,0x45,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem_internal.h"
                      ,line);
        return false;
      }
      if (uVar1 >> 0x3b != 0) {
        line = 0x153;
        goto LAB_002d4659;
      }
      sVar5 = uVar1 * 2;
    }
    pNVar3 = (NotDefaultConstructible *)OPENSSL_malloc(sVar5 << 4);
    if (pNVar3 == (NotDefaultConstructible *)0x0) {
      return false;
    }
    pNVar2 = this->data_;
    uVar6 = this->size_;
    for (lVar4 = 0; uVar6 << 4 != lVar4; lVar4 = lVar4 + 0x10) {
      Array<int>::Array((Array<int> *)((long)&(pNVar3->array).data_ + lVar4),
                        (Array<int> *)((long)&(pNVar2->array).data_ + lVar4));
    }
    clear(this);
    this->data_ = pNVar3;
    this->size_ = uVar6;
    this->capacity_ = sVar5;
  }
  Array<int>::Array(&pNVar3[uVar6].array,&elem->array);
  this->size_ = this->size_ + 1;
  return true;
}

Assistant:

[[nodiscard]] bool Push(T elem) {
    if (!MaybeGrow()) {
      return false;
    }
    new (&data_[size_]) T(std::move(elem));
    size_++;
    return true;
  }